

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::SPxSolverBase<double>::getDualfarkas
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  bool bVar1;
  Status SVar2;
  SPxStatusException *this_00;
  SPxSolverBase<double> *in_RDI;
  string *in_stack_ffffffffffffff98;
  SPxSolverBase<double> *in_stack_ffffffffffffffa8;
  allocator *paVar3;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = isInitialized(in_RDI);
  if (!bVar1) {
    this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
    paVar3 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"XSOLVE10 No Problem loaded",paVar3);
    SPxStatusException::SPxStatusException(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
  }
  VectorBase<double>::clear((VectorBase<double> *)in_RDI);
  VectorBase<double>::operator=
            (in_stack_ffffffffffffffc0,
             (SVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  SVar2 = status(in_stack_ffffffffffffffa8);
  return SVar2;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualfarkas(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE10 No Problem loaded");
      // return NOT_INIT;
   }

   assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::INFEASIBLE);
   p_vector.clear();
   p_vector = dualFarkas;

   return status();
}